

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O0

void __thiscall
HistogramBasedDistribution::printWithGaussian
          (HistogramBasedDistribution *this,ostream *os,double mean,double stddev)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  void *pvVar5;
  void *in_RSI;
  HistogramBasedDistribution *in_RDI;
  double dVar6;
  int length_1;
  int length;
  double p;
  int start;
  const_iterator cit;
  normal norm;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  *in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  ostream *in_stack_ffffffffffffff88;
  double local_48;
  int local_3c;
  __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_38 [5];
  void *local_10;
  
  local_10 = in_RSI;
  boost::math::
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::normal_distribution
            ((normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
              *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70);
  local_38[0]._M_current =
       (pair<int,_double> *)
       std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                 (in_stack_ffffffffffffff68);
  local_3c = -1;
  local_48 = -1.0;
  do {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
              (in_stack_ffffffffffffff68);
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (bVar2) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator->(local_38);
      iVar1 = ppVar3->first;
      poVar4 = (ostream *)std::ostream::operator<<(local_10,local_3c);
      poVar4 = std::operator<<(poVar4,' ');
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator->(local_38);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar3->first + -1);
      poVar4 = std::operator<<(poVar4,' ');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_48 * (double)(iVar1 - local_3c));
      in_stack_ffffffffffffff88 = std::operator<<(poVar4,' ');
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
      ::operator->(local_38);
      dVar6 = normal_mass(in_RDI,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                          (int)in_stack_ffffffffffffff88,
                          (normal *)CONCAT44(local_3c,in_stack_ffffffffffffff80));
      pvVar5 = (void *)std::ostream::operator<<(in_stack_ffffffffffffff88,dVar6);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      in_stack_ffffffffffffff84 = local_3c;
    }
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator->(local_38);
    local_3c = ppVar3->first;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator->(local_38);
    local_48 = ppVar3->second;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator++(local_38);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
              (in_stack_ffffffffffffff68);
    bVar2 = __gnu_cxx::operator==
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_ffffffffffffff68);
  } while (!bVar2);
  iVar1 = in_RDI->max;
  poVar4 = (ostream *)std::ostream::operator<<(local_10,local_3c);
  poVar4 = std::operator<<(poVar4,' ');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI->max);
  poVar4 = std::operator<<(poVar4,' ');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_48 * (double)((iVar1 - local_3c) + 1));
  poVar4 = std::operator<<(poVar4,' ');
  dVar6 = normal_mass(in_RDI,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                      (int)in_stack_ffffffffffffff88,
                      (normal *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar6);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void HistogramBasedDistribution::printWithGaussian(ostream& os, double mean, double stddev) const {
	boost::math::normal norm(mean, stddev);
	vector<HistogramBasedDistribution::value_t>::const_iterator cit = values.begin();
	int start = -1;
	double p = -1.0;
	while (true) {
		if (cit != values.begin()) {
			int length = cit->first - start;
			os << start << ' ' << (cit->first-1) << ' ' << (p*length) << ' ' << normal_mass(start,cit->first-1,norm) << endl;
		}
		start = cit->first;
		p = cit->second;
		++cit;
		if (cit == values.end()) {
			int length = max - start + 1;
			os << start << ' ' << max << ' ' << (p*length) << ' ' << normal_mass(start,max,norm) << endl;
			break;
		}
	}
}